

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

int SSL_parse_client_hello(SSL *ssl,SSL_CLIENT_HELLO *out,uint8_t *in,size_t len)

{
  bool bVar1;
  size_t sVar2;
  Span<const_unsigned_char> local_50;
  undefined1 local_40 [8];
  CBS cbs;
  size_t len_local;
  uint8_t *in_local;
  SSL_CLIENT_HELLO *out_local;
  SSL *ssl_local;
  
  cbs.len = len;
  bssl::Span<const_unsigned_char>::Span(&local_50,in,len);
  cbs_st::cbs_st((cbs_st *)local_40,local_50);
  bVar1 = bssl::ssl_parse_client_hello_with_trailing_data(ssl,(CBS *)local_40,out);
  if (bVar1) {
    sVar2 = CBS_len((CBS *)local_40);
    if (sVar2 == 0) {
      ssl_local._4_4_ = 1;
    }
    else {
      ERR_put_error(0x10,0,0x83,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x129a);
      ssl_local._4_4_ = 0;
    }
  }
  else {
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

int SSL_parse_client_hello(const SSL *ssl, SSL_CLIENT_HELLO *out,
                           const uint8_t *in, size_t len) {
  CBS cbs = Span(in, len);
  if (!ssl_parse_client_hello_with_trailing_data(ssl, &cbs, out)) {
    return 0;
  }
  if (CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CLIENTHELLO_PARSE_FAILED);
    return 0;
  }
  return 1;
}